

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall
crnlib::dxt_hc::determine_color_endpoint_clusters_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  vector_vec_type *this_00;
  tile_details *ptVar5;
  vec<6U,_float> *v_00;
  vec<6U,_float> *pvVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float d5;
  float d4;
  float d3;
  float d2;
  float d1;
  float d0;
  float dist;
  vec6F *c;
  uint i;
  uint best_index;
  float best_dist;
  float node_dist;
  vec6F *v;
  uint local_38;
  uint tEnd;
  uint t;
  uint num_tasks;
  vector<crnlib::vec<6U,_float>_> *codebook;
  tree_clusterizer<crnlib::vec<6U,_float>_> *vq;
  void *pData_ptr_local;
  uint64 data_local;
  dxt_hc *this_local;
  
  this_00 = tree_clusterizer<crnlib::vec<6U,_float>_>::get_codebook
                      ((tree_clusterizer<crnlib::vec<6U,_float>_> *)pData_ptr);
  uVar2 = task_pool::get_num_threads(this->m_pTask_pool);
  uVar3 = vector<crnlib::dxt_hc::tile_details>::size(&this->m_tiles);
  local_38 = (uint)((uVar3 * data) / (ulong)(uVar2 + 1));
  uVar3 = vector<crnlib::dxt_hc::tile_details>::size(&this->m_tiles);
  do {
    if ((uint)(((ulong)uVar3 * (data + 1)) / (ulong)(uVar2 + 1)) <= local_38) {
      return;
    }
    ptVar5 = vector<crnlib::dxt_hc::tile_details>::operator[](&this->m_tiles,local_38);
    uVar4 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&ptVar5->pixels);
    if (uVar4 != 0) {
      ptVar5 = vector<crnlib::dxt_hc::tile_details>::operator[](&this->m_tiles,local_38);
      v_00 = &ptVar5->color_endpoint;
      uVar4 = tree_clusterizer<crnlib::vec<6U,_float>_>::get_node_index
                        ((tree_clusterizer<crnlib::vec<6U,_float>_> *)pData_ptr,v_00);
      pvVar6 = vector<crnlib::vec<6U,_float>_>::operator[](this_00,uVar4);
      fVar7 = vec<6U,_float>::squared_distance(pvVar6,v_00);
      i = 0x7cf0bdc2;
      c._4_4_ = 0;
      c._0_4_ = 0;
      while( true ) {
        uVar4 = vector<crnlib::vec<6U,_float>_>::size(this_00);
        if (uVar4 <= (uint)c) break;
        pvVar6 = vector<crnlib::vec<6U,_float>_>::operator[](this_00,(uint)c);
        fVar8 = vec<6U,_float>::operator[](pvVar6,0);
        fVar9 = vec<6U,_float>::operator[](v_00,0);
        fVar10 = vec<6U,_float>::operator[](pvVar6,1);
        fVar11 = vec<6U,_float>::operator[](v_00,1);
        fVar8 = (fVar10 - fVar11) * (fVar10 - fVar11) + (fVar8 - fVar9) * (fVar8 - fVar9) + 0.0;
        uVar1 = c._4_4_;
        if (fVar8 <= fVar7) {
          fVar9 = vec<6U,_float>::operator[](pvVar6,2);
          fVar10 = vec<6U,_float>::operator[](v_00,2);
          fVar11 = vec<6U,_float>::operator[](pvVar6,3);
          fVar12 = vec<6U,_float>::operator[](v_00,3);
          fVar8 = (fVar11 - fVar12) * (fVar11 - fVar12) +
                  (fVar9 - fVar10) * (fVar9 - fVar10) + fVar8;
          if (fVar8 <= fVar7) {
            fVar9 = vec<6U,_float>::operator[](pvVar6,4);
            fVar10 = vec<6U,_float>::operator[](v_00,4);
            fVar11 = vec<6U,_float>::operator[](pvVar6,5);
            fVar12 = vec<6U,_float>::operator[](v_00,5);
            fVar8 = (fVar11 - fVar12) * (fVar11 - fVar12) +
                    (fVar9 - fVar10) * (fVar9 - fVar10) + fVar8;
            if (fVar8 < (float)i) {
              c._4_4_ = (uint)c;
              uVar1 = c._4_4_;
              c._4_2_ = (uint16)(uint)c;
              i = (uint)fVar8;
              if ((fVar8 == 0.0) && (!NAN(fVar8))) break;
            }
          }
        }
        c._4_4_ = uVar1;
        c._0_4_ = (uint)c + 1;
      }
      ptVar5 = vector<crnlib::dxt_hc::tile_details>::operator[](&this->m_tiles,local_38);
      ptVar5->cluster_indices[0] = c._4_2_;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void dxt_hc::determine_color_endpoint_clusters_task(uint64 data, void* pData_ptr)
    {
        tree_clusterizer<vec6F>* vq = (tree_clusterizer<vec6F>*)pData_ptr;
        const crnlib::vector<vec6F>& codebook = vq->get_codebook();
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        for (uint t = m_tiles.size() * data / num_tasks, tEnd = m_tiles.size() * (data + 1) / num_tasks; t < tEnd; t++)
        {
            if (m_tiles[t].pixels.size())
            {
                const vec6F& v = m_tiles[t].color_endpoint;
                float node_dist = codebook[vq->get_node_index(v)].squared_distance(v);
                float best_dist = math::cNearlyInfinite;
                uint best_index = 0;
                for (uint i = 0; i < codebook.size(); i++)
                {
                    const vec6F& c = codebook[i];
                    float dist = 0;
                    float d0 = c[0] - v[0];
                    dist += d0 * d0;
                    float d1 = c[1] - v[1];
                    dist += d1 * d1;
                    if (dist > node_dist)
                    {
                        continue;
                    }
                    float d2 = c[2] - v[2];
                    dist += d2 * d2;
                    float d3 = c[3] - v[3];
                    dist += d3 * d3;
                    if (dist > node_dist)
                    {
                        continue;
                    }
                    float d4 = c[4] - v[4];
                    dist += d4 * d4;
                    float d5 = c[5] - v[5];
                    dist += d5 * d5;
                    if (dist < best_dist)
                    {
                        best_dist = dist;
                        best_index = i;
                        if (best_dist == 0.0f)
                        {
                            break;
                        }
                    }
                }
                m_tiles[t].cluster_indices[cColor] = best_index;
            }
        }
    }